

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

void Omega_h::context_adding_routine
               (vector<int,_std::allocator<int>_> *lane,int zeta_pointer,Context *contexts_generated
               ,Contexts *contexts,bool verbose,GrammarPtr *grammar)

{
  int i;
  bool bVar1;
  ostream *poVar2;
  const_reference pvVar3;
  element_type *peVar4;
  reference pvVar5;
  byte local_51;
  value_type tau_r_addr;
  value_type v_r;
  int r;
  GrammarPtr *grammar_local;
  bool verbose_local;
  Contexts *contexts_local;
  Context *contexts_generated_local;
  int zeta_pointer_local;
  vector<int,_std::allocator<int>_> *lane_local;
  
  tau_r_addr = zeta_pointer;
  if (verbose) {
    std::operator<<((ostream *)&std::cerr,"  CONTEXT ADDING ROUTINE\n");
    std::operator<<((ostream *)&std::cerr,"  LANE:");
    print_stack(lane);
    poVar2 = std::operator<<((ostream *)&std::cerr,"  $\\zeta$-POINTER = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,zeta_pointer);
    std::operator<<(poVar2,'\n');
  }
  while( true ) {
    local_51 = 0;
    if (-1 < tau_r_addr) {
      bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(contexts_generated);
      local_51 = bVar1 ^ 0xff;
    }
    if ((local_51 & 1) == 0) break;
    pvVar3 = at<int>(lane,tau_r_addr);
    i = *pvVar3;
    if (verbose) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"    r = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,tau_r_addr);
      std::operator<<(poVar2,", $v_r$ = ");
    }
    if (i < 0) {
      if (verbose) {
        if (i == -0x1b1) {
          std::operator<<((ostream *)&std::cerr,"marker\n");
        }
        else if (i == -100) {
          std::operator<<((ostream *)&std::cerr,"zero\n");
        }
      }
    }
    else {
      if (verbose) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"$\\tau_r$ = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
        std::operator<<(poVar2,'\n');
        std::operator<<((ostream *)&std::cerr,"    CONTEXTS_GENERATED = ");
        peVar4 = std::
                 __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)grammar);
        print_set(contexts_generated,peVar4);
        std::operator<<((ostream *)&std::cerr,"\n    CONTEXTS_$\\tau_r$ = ");
        pvVar5 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
        peVar4 = std::
                 __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)grammar);
        print_set(pvVar5,peVar4);
        std::operator<<((ostream *)&std::cerr,
                        "\n    CONTEXTS_GENERATED <- CONTEXTS_GENERATED - CONTEXTS_$\\tau_r$");
      }
      pvVar5 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
      subtract_from<int>(contexts_generated,pvVar5);
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,"\n    CONTEXTS_GENERATED = ");
        peVar4 = std::
                 __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)grammar);
        print_set(contexts_generated,peVar4);
        std::operator<<((ostream *)&std::cerr,
                        "\n    CONTEXTS_$\\tau_r$ <- CONTEXTS_$\\tau_r$ U CONTEXTS_GENERATED");
      }
      pvVar5 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
      unite_with<int>(pvVar5,contexts_generated);
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,"\n    CONTEXTS_$\\tau_r$ = ");
        pvVar5 = at<std::set<int,std::less<int>,std::allocator<int>>>(contexts,i);
        peVar4 = std::
                 __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)grammar);
        print_set(pvVar5,peVar4);
        std::operator<<((ostream *)&std::cerr,"\n");
      }
    }
    tau_r_addr = tau_r_addr + -1;
  }
  return;
}

Assistant:

static void context_adding_routine(std::vector<int> const& lane,
    int zeta_pointer, Context& contexts_generated, Contexts& contexts,
    bool verbose, GrammarPtr grammar) {
  if (verbose) {
    std::cerr << "  CONTEXT ADDING ROUTINE\n";
    std::cerr << "  LANE:";
    print_stack(lane);
    std::cerr << "  $\\zeta$-POINTER = " << zeta_pointer << '\n';
  }
  for (int r = zeta_pointer; r >= 0 && (!contexts_generated.empty()); --r) {
    auto v_r = at(lane, r);
    if (verbose) std::cerr << "    r = " << r << ", $v_r$ = ";
    if (v_r < 0) {
      if (verbose) {
        if (v_r == MARKER)
          std::cerr << "marker\n";
        else if (v_r == ZERO)
          std::cerr << "zero\n";
      }
      continue;
    }
    auto tau_r_addr = v_r;
    if (verbose) {
      std::cerr << "$\\tau_r$ = " << tau_r_addr << '\n';
      std::cerr << "    CONTEXTS_GENERATED = ";
      print_set(contexts_generated, *grammar);
      std::cerr << "\n    CONTEXTS_$\\tau_r$ = ";
      print_set(at(contexts, tau_r_addr), *grammar);
      std::cerr << "\n    CONTEXTS_GENERATED <- CONTEXTS_GENERATED - "
                   "CONTEXTS_$\\tau_r$";
    }
    subtract_from(contexts_generated, at(contexts, tau_r_addr));
    if (verbose) {
      std::cerr << "\n    CONTEXTS_GENERATED = ";
      print_set(contexts_generated, *grammar);
      std::cerr << "\n    CONTEXTS_$\\tau_r$ <- CONTEXTS_$\\tau_r$ U "
                   "CONTEXTS_GENERATED";
    }
    unite_with(at(contexts, tau_r_addr), contexts_generated);
    if (verbose) {
      std::cerr << "\n    CONTEXTS_$\\tau_r$ = ";
      print_set(at(contexts, tau_r_addr), *grammar);
      std::cerr << "\n";
    }
  }
}